

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyle::SetFieldOverride(ON_DimStyle *this,field field_id,bool bOverrideParent)

{
  ON__UINT32 OVar1;
  ON__UINT32 *pOVar2;
  ON__UINT32 bits0;
  ON__UINT32 *bits;
  byte local_15;
  ON__UINT32 mask;
  bool bOverrideParent_local;
  ON_DimStyle *pOStack_10;
  field field_id_local;
  ON_DimStyle *this_local;
  
  if (((Index < field_id) && (field_id < Count)) &&
     ((this->m_field_override_parent_count != 0 || (bOverrideParent)))) {
    bits._4_4_ = 0;
    local_15 = bOverrideParent;
    mask = field_id;
    pOStack_10 = this;
    pOVar2 = Internal_GetOverrideParentBit(this,field_id,(ON__UINT32 *)((long)&bits + 4));
    if (pOVar2 != (ON__UINT32 *)0x0) {
      OVar1 = *pOVar2;
      if ((local_15 & 1) == 0) {
        *pOVar2 = (bits._4_4_ ^ 0xffffffff) & *pOVar2;
        if (*pOVar2 != OVar1) {
          this->m_field_override_parent_count = this->m_field_override_parent_count - 1;
          Internal_ContentChange(this);
        }
      }
      else {
        *pOVar2 = bits._4_4_ | *pOVar2;
        if (*pOVar2 != OVar1) {
          this->m_field_override_parent_count = this->m_field_override_parent_count + 1;
          Internal_ContentChange(this);
        }
      }
    }
  }
  return;
}

Assistant:

void ON_DimStyle::SetFieldOverride(ON_DimStyle::field field_id, bool bOverrideParent)
{
  // Note well:
  //   The Name and Index properties cannot be inherited from a parent dimension style.
  if (
    static_cast<unsigned int>(field_id) > static_cast<unsigned int>(ON_DimStyle::field::Index)
    && static_cast<unsigned int>(field_id) < static_cast<unsigned int>(ON_DimStyle::field::Count)
    && (m_field_override_parent_count > 0 || bOverrideParent)
    )
  {
    ON__UINT32 mask = 0;
    ON__UINT32* bits = Internal_GetOverrideParentBit(field_id, &mask);
    if (nullptr != bits)
    {
      const ON__UINT32 bits0 = *bits;
      if (bOverrideParent)
      {
        // field_id bit = 1 indicates the field value is independent of the parent.
        *bits |= mask;
        if (*bits != bits0)
        {
          m_field_override_parent_count++;
          Internal_ContentChange();
        }
      }
      else
      {
        // field_id bit = 0 indicates the field value is inherited from the parent.
        *bits &= ~mask;
        if (*bits != bits0)
        {
          m_field_override_parent_count--;
          Internal_ContentChange();
        }
      }
    }
  }
}